

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  SyntaxNode *this_00;
  int iVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  size_t sVar3;
  Diagnostic *this_01;
  char *__s1;
  size_type __rlen;
  ulong uVar4;
  long lVar5;
  string_view arg;
  SourceRange SVar6;
  
  uVar4 = (pragma->args).elements._M_extent._M_extent_value + 1;
  if (1 < uVar4) {
    uVar4 = uVar4 >> 1;
    lVar5 = 0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((pragma->args).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      this_00 = *ppSVar2;
      if ((this_00->kind == SimplePragmaExpression) && ((short)this_00[1].kind == TokenList)) {
        arg = Token::rawText((Token *)(this_00 + 1));
        __s1 = arg._M_str;
        sVar3 = arg._M_len;
        if ((long)sVar3 < 7) {
          if (sVar3 == 0) goto LAB_006acfc9;
LAB_006acfff:
          if (sVar3 == 4) {
            iVar1 = bcmp(__s1,"once",4);
            goto joined_r0x006ad035;
          }
LAB_006ad037:
          SVar6 = Token::range((Token *)(this_00 + 1));
          this_01 = addDiag(this,(DiagCode)0x2b0004,SVar6);
          Diagnostic::operator<<(this_01,arg);
        }
        else if (sVar3 == 10) {
          iVar1 = bcmp(__s1,"diagnostic",10);
joined_r0x006ad035:
          if (iVar1 != 0) goto LAB_006ad037;
        }
        else {
          if (sVar3 != 7) goto LAB_006ad037;
          iVar1 = bcmp(__s1,"protect",7);
          if (iVar1 != 0) goto LAB_006acfff;
        }
        if ((sVar3 == 7) && (iVar1 = bcmp(__s1,"protect",7), iVar1 == 0)) {
          this->protectEncryptDepth = 0;
          this->protectDecryptDepth = 0;
          this->protectLineLength = 0;
          this->protectBytes = 0;
          this->protectEncoding = Raw;
        }
      }
      else {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(this_00);
        addDiag(this,(DiagCode)0x90004,SVar6);
      }
LAB_006acfc9:
      lVar5 = lVar5 + 0x30;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                std::string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}